

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall
ON_Brep::IsCorrupt(ON_Brep *this,bool bRepair,bool bSilentError,ON_TextLog *text_log)

{
  ON_BrepVertex *pOVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  ON_BrepFace *f;
  int fi;
  ON_BrepLoop *l;
  int li;
  ON_BrepTrim *t;
  int ti;
  ON_BrepEdge *e;
  int ei;
  ON_BrepVertex *v;
  ON_Brep *pOStack_58;
  int vi;
  ON_Brep *ignored_this_ptr;
  ON__UINT_PTR text_log_ptr;
  int local_40;
  int F_count;
  int L_count;
  int T_count;
  int E_count;
  int V_count;
  int S_count;
  int C3_count;
  int C2_count;
  bool bCorrupt;
  ON_TextLog *text_log_local;
  bool bSilentError_local;
  ON_Brep *pOStack_10;
  bool bRepair_local;
  ON_Brep *this_local;
  
  C3_count._3_1_ = 0;
  _C2_count = (ON_Brep *)text_log;
  text_log_local._6_1_ = bSilentError;
  text_log_local._7_1_ = bRepair;
  pOStack_10 = this;
  S_count = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  V_count = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  E_count = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  T_count = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
  L_count = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  F_count = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  local_40 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  text_log_ptr._4_4_ = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  ignored_this_ptr = _C2_count;
  if ((text_log_local._6_1_ & 1) != 0) {
    ignored_this_ptr = (ON_Brep *)((ulong)_C2_count | 1);
  }
  if ((text_log_local._7_1_ & 1) != 0) {
    ignored_this_ptr = (ON_Brep *)((ulong)ignored_this_ptr | 2);
  }
  pOStack_58 = this;
  for (v._4_4_ = 0; v._4_4_ < T_count; v._4_4_ = v._4_4_ + 1) {
    pOVar1 = ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,v._4_4_);
    Internal_ValidateBrepComponentBackPtr
              ((ON__UINT_PTR)ignored_this_ptr,
               L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",(bool *)((long)&C3_count + 3)
               ,this,&stack0xffffffffffffffa8,v._4_4_,&pOVar1->m_vertex_index);
    Internal_ValidateBrepIndexSimpleArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepVertex.m_ei[] index.\n",
               (bool *)((long)&C3_count + 3),L_count,&pOVar1->m_ei);
  }
  for (e._4_4_ = 0; e._4_4_ < L_count; e._4_4_ = e._4_4_ + 1) {
    pOVar2 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,e._4_4_);
    Internal_ValidateBrepComponentBackPtr
              ((ON__UINT_PTR)ignored_this_ptr,
               L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
               (bool *)((long)&C3_count + 3),this,&pOVar2->m_brep,e._4_4_,&pOVar2->m_edge_index);
    Internal_ValidateBrepIndexArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepEdge.m_vi[] index.\n",
               (bool *)((long)&C3_count + 3),T_count,2,pOVar2->m_vi);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepEdge.m_c3i index.\n",
               (bool *)((long)&C3_count + 3),V_count,&pOVar2->m_c3i);
    Internal_ValidateBrepIndexSimpleArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepEdge.m_ti[] index.\n",
               (bool *)((long)&C3_count + 3),F_count,&pOVar2->m_ti);
  }
  for (t._4_4_ = 0; t._4_4_ < F_count; t._4_4_ = t._4_4_ + 1) {
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,t._4_4_);
    Internal_ValidateBrepComponentBackPtr
              ((ON__UINT_PTR)ignored_this_ptr,
               L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
               (bool *)((long)&C3_count + 3),this,&pOVar3->m_brep,t._4_4_,&pOVar3->m_trim_index);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepTrim.m_c2i index.\n",
               (bool *)((long)&C3_count + 3),S_count,&pOVar3->m_c2i);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepTrim.m_ei index.\n",
               (bool *)((long)&C3_count + 3),L_count,&pOVar3->m_ei);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepTrim.m_li index.\n",
               (bool *)((long)&C3_count + 3),local_40,&pOVar3->m_li);
    Internal_ValidateBrepIndexArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepTrim.m_vi[] index.\n",
               (bool *)((long)&C3_count + 3),T_count,2,pOVar3->m_vi);
  }
  for (l._4_4_ = 0; l._4_4_ < local_40; l._4_4_ = l._4_4_ + 1) {
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,l._4_4_);
    Internal_ValidateBrepComponentBackPtr
              ((ON__UINT_PTR)ignored_this_ptr,
               L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
               (bool *)((long)&C3_count + 3),this,&pOVar4->m_brep,l._4_4_,&pOVar4->m_loop_index);
    Internal_ValidateBrepIndexSimpleArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepLoop.m_ti[] index.\n",
               (bool *)((long)&C3_count + 3),F_count,&pOVar4->m_ti);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepLoop.m_fi index.\n",
               (bool *)((long)&C3_count + 3),text_log_ptr._4_4_,&pOVar4->m_fi);
  }
  for (f._4_4_ = 0; f._4_4_ < text_log_ptr._4_4_; f._4_4_ = f._4_4_ + 1) {
    pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                       ((ON_ClassArray<ON_BrepFace> *)&this->m_F,f._4_4_);
    Internal_ValidateBrepComponentBackPtr
              ((ON__UINT_PTR)ignored_this_ptr,
               L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
               (bool *)((long)&C3_count + 3),this,&pOVar5->m_brep,f._4_4_,&pOVar5->m_face_index);
    Internal_ValidateBrepIndexSimpleArray
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepFace.m_li[] index.\n",
               (bool *)((long)&C3_count + 3),local_40,&pOVar5->m_li);
    Internal_ValidateBrepIndex
              ((ON__UINT_PTR)ignored_this_ptr,L"Corrupt ON_BrepFace.m_si index.\n",
               (bool *)((long)&C3_count + 3),E_count,&pOVar5->m_si);
  }
  return (bool)(C3_count._3_1_ & 1);
}

Assistant:

bool ON_Brep::IsCorrupt(
  bool bRepair,
  bool bSilentError,
  class ON_TextLog* text_log
) const
{
  bool bCorrupt = false;

  const int C2_count = m_C2.Count();
  const int C3_count = m_C3.Count();
  const int S_count = m_S.Count();
  const int V_count = m_V.Count();
  const int E_count = m_E.Count();
  const int T_count = m_T.Count();
  const int L_count = m_L.Count();
  const int F_count = m_F.Count();

  ON__UINT_PTR text_log_ptr = (ON__UINT_PTR)text_log;
  if (bSilentError)
    text_log_ptr |= 1;
  if (bRepair)
    text_log_ptr |= 2;

  ON_Brep* ignored_this_ptr = const_cast<ON_Brep*>(this);

  for (int vi = 0; vi < V_count; vi++)
  {
    const ON_BrepVertex& v = m_V[vi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_vertex_index back pointer.\n",
      bCorrupt,
      this, &ignored_this_ptr,
      vi, v.m_vertex_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepVertex.m_ei[] index.\n",
      bCorrupt,
      E_count,
      v.m_ei
    );
  }
  
  for (int ei = 0; ei < E_count; ei++)
  {
    const ON_BrepEdge& e = m_E[ei];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepEdge m_brep or m_edge_index back pointers.\n",
      bCorrupt,
      this, &e.m_brep,
      ei, e.m_edge_index
    );

    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      e.m_vi
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_c3i index.\n",
      bCorrupt,
      C3_count,
      e.m_c3i
    );
    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepEdge.m_ti[] index.\n",
      bCorrupt,
      T_count,
      e.m_ti
    );
  }
  
  for (int ti = 0; ti < T_count; ti++)
  {
    const ON_BrepTrim& t = m_T[ti];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepTrim m_brep or m_trim_index back pointers.\n",
      bCorrupt,
      this, &t.m_brep,
      ti, t.m_trim_index
    );

    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_c2i index.\n",
      bCorrupt,
      C2_count,
      t.m_c2i
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_ei index.\n",
      bCorrupt,
      E_count,
      t.m_ei
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_li index.\n",
      bCorrupt,
      L_count,
      t.m_li
    );
    Internal_ValidateBrepIndexArray(
      text_log_ptr,
      L"Corrupt ON_BrepTrim.m_vi[] index.\n",
      bCorrupt,
      V_count,
      2,
      t.m_vi
    );
  }
  
  for (int li = 0; li < L_count; li++)
  {
    const ON_BrepLoop& l = m_L[li];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepLoop m_brep or m_loop_index back pointers.\n",
      bCorrupt,
      this, &l.m_brep,
      li, l.m_loop_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_ti[] index.\n",
      bCorrupt,
      T_count,
      l.m_ti
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepLoop.m_fi index.\n",
      bCorrupt,
      F_count,
      l.m_fi
    );
  }
  
  for (int fi = 0; fi < F_count; fi++)
  {
    const ON_BrepFace& f = m_F[fi];
    Internal_ValidateBrepComponentBackPtr(
      text_log_ptr,
      L"Corrupt ON_BrepFace m_brep or m_face_index back pointers.\n",
      bCorrupt,
      this, &f.m_brep,
      fi, f.m_face_index
    );

    Internal_ValidateBrepIndexSimpleArray(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_li[] index.\n",
      bCorrupt,
      L_count,
      f.m_li
    );
    Internal_ValidateBrepIndex(
      text_log_ptr,
      L"Corrupt ON_BrepFace.m_si index.\n",
      bCorrupt,
      S_count,
      f.m_si
    );
  }

  return bCorrupt;
}